

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O2

bool __thiscall
crnd::crn_unpacker::unpack_dxt5
          (crn_unpacker *this,uint8 **pDst,uint32 row_pitch_in_bytes,uint32 output_width,
          uint32 output_height)

{
  symbol_codec *this_00;
  vector<crnd::crn_unpacker::block_buffer_element> *this_01;
  uint uVar1;
  uint uVar2;
  unsigned_short *puVar3;
  byte bVar4;
  uint32 uVar5;
  uint uVar6;
  uint32 uVar7;
  uint8 *puVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  block_buffer_element *pbVar13;
  ulong uVar14;
  uint new_size;
  uint uVar15;
  uint uVar16;
  long lVar17;
  bool bVar18;
  uint local_d0;
  uint8 *local_b0;
  
  uVar1 = (this->m_color_endpoints).m_size;
  uVar2 = (this->m_alpha_endpoints).m_size;
  new_size = output_width + 1 & 0xfffffffe;
  this_01 = &this->m_block_buffer;
  if ((this->m_block_buffer).m_size < new_size) {
    vector<crnd::crn_unpacker::block_buffer_element>::resize(this_01,new_size);
  }
  this_00 = &this->m_codec;
  uVar10 = 0;
  uVar12 = 0;
  local_d0 = 0;
  uVar16 = 0;
  do {
    if ((this->m_pHeader->m_faces).m_buf[0] <= uVar10) {
      return true;
    }
    local_b0 = pDst[uVar10];
    for (uVar15 = 0; uVar15 != (output_height + 1 & 0xfffffffe); uVar15 = uVar15 + 1) {
      bVar18 = uVar15 < output_height;
      puVar8 = local_b0 + (long)(int)((row_pitch_in_bytes >> 2) + new_size * -4) * 4;
      uVar9 = 0;
      uVar14 = 0;
      for (lVar17 = 0; uVar11 = (uint)uVar12, (ulong)(output_width + 1 & 0xfffffffe) << 3 != lVar17;
          lVar17 = lVar17 + 8) {
        if (((uVar15 | uVar9) & 1) == 0) {
          uVar5 = symbol_codec::decode(this_00,&this->m_reference_encoding_dm);
          uVar12 = (ulong)uVar5;
          pbVar13 = (block_buffer_element *)((long)&this_01->m_p->endpoint_reference + lVar17);
LAB_00111bc5:
          bVar4 = (byte)uVar12 & 3;
          pbVar13->endpoint_reference = (ushort)((byte)(uVar12 >> 2) & 3);
          uVar11 = (uint)(byte)((byte)uVar12 >> 4);
        }
        else {
          if ((uVar15 & 1) == 0) {
            pbVar13 = this_01->m_p + uVar14;
            goto LAB_00111bc5;
          }
          pbVar13 = (block_buffer_element *)((long)&this_01->m_p->endpoint_reference + lVar17);
          bVar4 = (byte)pbVar13->endpoint_reference;
        }
        if (bVar4 == 1) {
          pbVar13->color_endpoint_index = (uint16)uVar16;
          pbVar13->alpha0_endpoint_index = (uint16)local_d0;
        }
        else if (bVar4 == 0) {
          uVar5 = symbol_codec::decode(this_00,this->m_endpoint_delta_dm);
          uVar6 = 0;
          if (uVar1 <= uVar5 + uVar16) {
            uVar6 = uVar1;
          }
          uVar16 = (uVar5 + uVar16) - uVar6;
          pbVar13->color_endpoint_index = (uint16)uVar16;
          uVar5 = symbol_codec::decode(this_00,this->m_endpoint_delta_dm + 1);
          uVar6 = 0;
          if (uVar2 <= uVar5 + local_d0) {
            uVar6 = uVar2;
          }
          local_d0 = (uVar5 + local_d0) - uVar6;
          pbVar13->alpha0_endpoint_index = (uint16)local_d0;
        }
        else {
          uVar16 = (uint)pbVar13->color_endpoint_index;
          local_d0 = (uint)pbVar13->alpha0_endpoint_index;
        }
        bVar18 = (bool)(bVar18 & uVar14 < output_width);
        uVar5 = symbol_codec::decode(this_00,this->m_selector_delta_dm);
        uVar7 = symbol_codec::decode(this_00,this->m_selector_delta_dm + 1);
        if (bVar18) {
          puVar3 = (this->m_alpha_selectors).m_p;
          *(uint *)(local_b0 + lVar17 * 2) =
               CONCAT22(puVar3[uVar7 * 3],(this->m_alpha_endpoints).m_p[local_d0]);
          *(undefined4 *)(local_b0 + lVar17 * 2 + 4) =
               *(undefined4 *)(puVar3 + (ulong)(uVar7 * 3) + 1);
          *(uint *)(local_b0 + lVar17 * 2 + 8) = (this->m_color_endpoints).m_p[uVar16];
          *(uint *)(local_b0 + lVar17 * 2 + 0xc) = (this->m_color_selectors).m_p[uVar5];
        }
        uVar14 = uVar14 + 1;
        uVar9 = uVar9 + 1;
        puVar8 = puVar8 + 0x10;
        uVar12 = (ulong)uVar11;
      }
      local_b0 = puVar8;
    }
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

bool unpack_dxt5(uint8** pDst, uint32 row_pitch_in_bytes, uint32 output_width, uint32 output_height)
        {
            const uint32 num_color_endpoints = m_color_endpoints.size();
            const uint32 num_alpha_endpoints = m_alpha_endpoints.size();
            const uint32 width = (output_width + 1) & ~1;
            const uint32 height = (output_height + 1) & ~1;
            const int32 delta_pitch_in_dwords = (row_pitch_in_bytes >> 2) - (width << 2);

            if (m_block_buffer.size() < width)
                m_block_buffer.resize(width);

            uint32 color_endpoint_index = 0;
            uint32 alpha0_endpoint_index = 0;
            uint8 reference_group = 0;

            for (uint32 f = 0; f < m_pHeader->m_faces; f++)
            {
                uint32* pData = (uint32*)pDst[f];
                for (uint32 y = 0; y < height; y++, pData += delta_pitch_in_dwords)
                {
                    bool visible = y < output_height;
                    for (uint32 x = 0; x < width; x++, pData += 4)
                    {
                        visible = visible && x < output_width;
                        if (!(y & 1) && !(x & 1))
                            reference_group = m_codec.decode(m_reference_encoding_dm);
                        block_buffer_element& buffer = m_block_buffer[x];
                        uint8 endpoint_reference;
                        if (y & 1)
                        {
                            endpoint_reference = buffer.endpoint_reference;
                        }
                        else
                        {
                            endpoint_reference = reference_group & 3;
                            reference_group >>= 2;
                            buffer.endpoint_reference = reference_group & 3;
                            reference_group >>= 2;
                        }
                        if (!endpoint_reference)
                        {
                            color_endpoint_index += m_codec.decode(m_endpoint_delta_dm[0]);
                            if (color_endpoint_index >= num_color_endpoints)
                                color_endpoint_index -= num_color_endpoints;
                            buffer.color_endpoint_index = color_endpoint_index;
                            alpha0_endpoint_index += m_codec.decode(m_endpoint_delta_dm[1]);
                            if (alpha0_endpoint_index >= num_alpha_endpoints)
                                alpha0_endpoint_index -= num_alpha_endpoints;
                            buffer.alpha0_endpoint_index = alpha0_endpoint_index;
                        }
                        else if (endpoint_reference == 1)
                        {
                            buffer.color_endpoint_index = color_endpoint_index;
                            buffer.alpha0_endpoint_index = alpha0_endpoint_index;
                        }
                        else
                        {
                            color_endpoint_index = buffer.color_endpoint_index;
                            alpha0_endpoint_index = buffer.alpha0_endpoint_index;
                        }
                        uint32 color_selector_index = m_codec.decode(m_selector_delta_dm[0]);
                        uint32 alpha0_selector_index = m_codec.decode(m_selector_delta_dm[1]);
                        if (visible)
                        {
                            const uint16* pAlpha0_selectors = &m_alpha_selectors[alpha0_selector_index * 3];
                            pData[0] = m_alpha_endpoints[alpha0_endpoint_index] | (pAlpha0_selectors[0] << 16);
                            pData[1] = pAlpha0_selectors[1] | (pAlpha0_selectors[2] << 16);
                            pData[2] = m_color_endpoints[color_endpoint_index];
                            pData[3] = m_color_selectors[color_selector_index];
                        }
                    }
                }
            }
            return true;
        }